

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManNodeIfToGia(Gia_Man_t *pNew,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Int_t *vLeaves,
                      int fHash)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  void **ppvVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  if (*(uint *)&(pIfObj->CutBest).field_0x1c < 0x2000000) {
    __assert_fail("pCut->nLeaves > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x580,
                  "int Gia_ManNodeIfToGia(Gia_Man_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *, int)");
  }
  pVVar2 = pIfMan->vObjs;
  uVar6 = 0;
  do {
    iVar5 = *(int *)(&pIfObj[1].field_0x0 + uVar6 * 4);
    if (((long)iVar5 < 0) || (pVVar2->nSize <= iVar5)) goto LAB_00210c9f;
    pvVar3 = pVVar2->pArray[iVar5];
    if (pvVar3 == (void *)0x0) break;
    if ((long)vLeaves->nSize <= (long)uVar6) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    *(int *)((long)pvVar3 + 0x50) = vLeaves->pArray[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar6 < (byte)(pIfObj->CutBest).field_0x1f);
  pVVar2 = pIfMan->vTemp;
  pVVar2->nSize = 0;
  iVar5 = Gia_ManNodeIfToGia_rec(pNew,pIfMan,pIfObj,pVVar2,fHash);
  if (iVar5 == -1) {
    Abc_Print(-1,"Gia_ManNodeIfToGia(): Computing local AIG has failed.\n");
  }
  else {
    if (0xffffff < *(uint *)&(pIfObj->CutBest).field_0x1c) {
      pVVar2 = pIfMan->vObjs;
      uVar6 = 0;
      do {
        iVar1 = *(int *)(&pIfObj[1].field_0x0 + uVar6 * 4);
        if (((long)iVar1 < 0) || (pVVar2->nSize <= iVar1)) {
LAB_00210c9f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = pVVar2->pArray[iVar1];
        if (pvVar3 == (void *)0x0) break;
        *(undefined4 *)((long)pvVar3 + 0x50) = 0;
        uVar6 = uVar6 + 1;
      } while (uVar6 < (byte)(pIfObj->CutBest).field_0x1f);
    }
    pVVar2 = pIfMan->vTemp;
    if (0 < pVVar2->nSize) {
      ppvVar4 = pVVar2->pArray;
      lVar7 = 0;
      do {
        *(undefined4 *)ppvVar4[lVar7] = 0;
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar2->nSize);
    }
  }
  return iVar5;
}

Assistant:

int Gia_ManNodeIfToGia( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vLeaves, int fHash )
{
    If_Cut_t * pCut;
    If_Obj_t * pLeaf;
    int i, iRes;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    assert( pCut->nLeaves > 1 );
    // set the leaf variables
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetDataInt( If_ObjCutBest(pLeaf), Vec_IntEntry(vLeaves, i) );
    // recursively compute the function while collecting visited cuts
    Vec_PtrClear( pIfMan->vTemp );
    iRes = Gia_ManNodeIfToGia_rec( pNew, pIfMan, pIfObj, pIfMan->vTemp, fHash ); 
    if ( iRes == ~0 )
    {
        Abc_Print( -1, "Gia_ManNodeIfToGia(): Computing local AIG has failed.\n" );
        return ~0;
    }
    // clean the cuts
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetDataInt( If_ObjCutBest(pLeaf), 0 );
    Vec_PtrForEachEntry( If_Cut_t *, pIfMan->vTemp, pCut, i )
        If_CutSetDataInt( pCut, 0 );
    return iRes;
}